

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslerror.cpp
# Opt level: O0

QString * __thiscall QSslError::errorString(QSslError *this)

{
  long lVar1;
  pointer pQVar2;
  char *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *errStr;
  int n;
  QString *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = -0x5555555555555556;
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QString::QString((QString *)0x39702e);
  pQVar2 = std::unique_ptr<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>::operator->
                     ((unique_ptr<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_> *)
                      0x397038);
  n = (int)((ulong)in_RDI >> 0x20);
  switch(pQVar2->error) {
  case NoError:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39709a);
    break;
  case UnableToGetIssuerCertificate:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x3970da);
    break;
  case UnableToDecryptCertificateSignature:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39711a);
    break;
  case UnableToDecodeIssuerPublicKey:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39715a);
    break;
  case CertificateSignatureFailed:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39719a);
    break;
  case CertificateNotYetValid:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x3971da);
    break;
  case CertificateExpired:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39721a);
    break;
  case InvalidNotBeforeField:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39725a);
    break;
  case InvalidNotAfterField:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39729a);
    break;
  case SelfSignedCertificate:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x3972da);
    break;
  case SelfSignedCertificateInChain:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39731a);
    break;
  case UnableToGetLocalIssuerCertificate:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39735a);
    break;
  case UnableToVerifyFirstCertificate:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39739a);
    break;
  default:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x3978fe);
    break;
  case InvalidCaCertificate:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x3973da);
    break;
  case PathLengthExceeded:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39741a);
    break;
  case InvalidPurpose:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39745a);
    break;
  case CertificateUntrusted:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39749a);
    break;
  case CertificateRejected:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x3974da);
    break;
  case SubjectIssuerMismatch:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39751a);
    break;
  case AuthorityIssuerSerialNumberMismatch:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39755a);
    break;
  case NoPeerCertificate:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39759a);
    break;
  case HostNameMismatch:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x3975da);
    break;
  case NoSslSupport:
    break;
  case CertificateBlacklisted:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39761f);
    break;
  case OcspNoResponseFound:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39765f);
    break;
  case OcspMalformedRequest:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39769f);
    break;
  case OcspMalformedResponse:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x3976df);
    break;
  case OcspInternalError:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39771f);
    break;
  case OcspTryLater:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39775f);
    break;
  case OcspSigRequred:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39779f);
    break;
  case OcspUnauthorized:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x3977df);
    break;
  case OcspResponseCannotBeTrusted:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39781f);
    break;
  case OcspResponseCertIdUnknown:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x39785f);
    break;
  case OcspResponseExpired:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x397896);
    break;
  case OcspStatusUnknown:
    QSslSocket::tr(in_RSI,(char *)this_00,n);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x3978ca);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QString QSslError::errorString() const
{
    QString errStr;
    switch (d->error) {
    case NoError:
        errStr = QSslSocket::tr("No error");
        break;
    case UnableToGetIssuerCertificate:
        errStr = QSslSocket::tr("The issuer certificate could not be found");
        break;
    case UnableToDecryptCertificateSignature:
        errStr = QSslSocket::tr("The certificate signature could not be decrypted");
        break;
    case UnableToDecodeIssuerPublicKey:
        errStr = QSslSocket::tr("The public key in the certificate could not be read");
        break;
    case CertificateSignatureFailed:
        errStr = QSslSocket::tr("The signature of the certificate is invalid");
        break;
    case CertificateNotYetValid:
        errStr = QSslSocket::tr("The certificate is not yet valid");
        break;
    case CertificateExpired:
        errStr = QSslSocket::tr("The certificate has expired");
        break;
    case InvalidNotBeforeField:
        errStr = QSslSocket::tr("The certificate's notBefore field contains an invalid time");
        break;
    case InvalidNotAfterField:
        errStr = QSslSocket::tr("The certificate's notAfter field contains an invalid time");
        break;
    case SelfSignedCertificate:
        errStr = QSslSocket::tr("The certificate is self-signed, and untrusted");
        break;
    case SelfSignedCertificateInChain:
        errStr = QSslSocket::tr("The root certificate of the certificate chain is self-signed, and untrusted");
        break;
    case UnableToGetLocalIssuerCertificate:
        errStr = QSslSocket::tr("The issuer certificate of a locally looked up certificate could not be found");
        break;
    case UnableToVerifyFirstCertificate:
        errStr = QSslSocket::tr("No certificates could be verified");
        break;
    case InvalidCaCertificate:
        errStr = QSslSocket::tr("One of the CA certificates is invalid");
        break;
    case PathLengthExceeded:
        errStr = QSslSocket::tr("The basicConstraints path length parameter has been exceeded");
        break;
    case InvalidPurpose:
        errStr = QSslSocket::tr("The supplied certificate is unsuitable for this purpose");
        break;
    case CertificateUntrusted:
        errStr = QSslSocket::tr("The root CA certificate is not trusted for this purpose");
        break;
    case CertificateRejected:
        errStr = QSslSocket::tr("The root CA certificate is marked to reject the specified purpose");
        break;
    case SubjectIssuerMismatch: // hostname mismatch
        errStr = QSslSocket::tr("The current candidate issuer certificate was rejected because its"
                                " subject name did not match the issuer name of the current certificate");
        break;
    case AuthorityIssuerSerialNumberMismatch:
        errStr = QSslSocket::tr("The current candidate issuer certificate was rejected because"
                             " its issuer name and serial number was present and did not match the"
                             " authority key identifier of the current certificate");
        break;
    case NoPeerCertificate:
        errStr = QSslSocket::tr("The peer did not present any certificate");
        break;
    case HostNameMismatch:
        errStr = QSslSocket::tr("The host name did not match any of the valid hosts"
                             " for this certificate");
        break;
    case NoSslSupport:
        break;
    case CertificateBlacklisted:
        errStr = QSslSocket::tr("The peer certificate is blacklisted");
        break;
    case OcspNoResponseFound:
        errStr = QSslSocket::tr("No OCSP status response found");
        break;
    case OcspMalformedRequest:
        errStr = QSslSocket::tr("The OCSP status request had invalid syntax");
        break;
    case OcspMalformedResponse:
        errStr = QSslSocket::tr("OCSP response contains an unexpected number of SingleResponse structures");
        break;
    case OcspInternalError:
        errStr = QSslSocket::tr("OCSP responder reached an inconsistent internal state");
        break;
    case OcspTryLater:
        errStr = QSslSocket::tr("OCSP responder was unable to return a status for the requested certificate");
        break;
    case OcspSigRequred:
        errStr = QSslSocket::tr("The server requires the client to sign the OCSP request in order to construct a response");
        break;
    case OcspUnauthorized:
        errStr = QSslSocket::tr("The client is not authorized to request OCSP status from this server");
        break;
    case OcspResponseCannotBeTrusted:
        errStr = QSslSocket::tr("OCSP responder's identity cannot be verified");
        break;
    case OcspResponseCertIdUnknown:
        errStr = QSslSocket::tr("The identity of a certificate in an OCSP response cannot be established");
        break;
    case OcspResponseExpired:
        errStr = QSslSocket::tr("The certificate status response has expired");
        break;
    case OcspStatusUnknown:
        errStr = QSslSocket::tr("The certificate's status is unknown");
        break;
    default:
        errStr = QSslSocket::tr("Unknown error");
        break;
    }

    return errStr;
}